

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_append_index
          (CompilerGLSL *this,string *expr,uint32_t param_2,SPIRType *type,AccessChainFlags flags,
          bool *param_5,uint32_t index)

{
  bool bVar1;
  bool local_a9;
  bool local_99;
  undefined1 local_98 [80];
  uint32_t local_48;
  uint32_t local_44;
  ID local_40;
  bool local_3b;
  char local_3a;
  byte local_39;
  bool nonuniform_index;
  bool register_expression_read;
  bool *pbStack_38;
  bool index_is_literal;
  bool *param_5_local;
  SPIRType *pSStack_28;
  AccessChainFlags flags_local;
  SPIRType *type_local;
  string *psStack_18;
  uint32_t param_2_local;
  string *expr_local;
  CompilerGLSL *this_local;
  
  local_39 = (flags & 1) != 0;
  local_3a = (flags & 8) == 0;
  pbStack_38 = param_5;
  param_5_local._4_4_ = flags;
  pSStack_28 = type;
  type_local._4_4_ = param_2;
  psStack_18 = expr;
  expr_local = (string *)this;
  ::std::__cxx11::string::operator+=((string *)expr,"[");
  TypedID<(spirv_cross::Types)0>::TypedID(&local_40,index);
  bVar1 = Compiler::has_decoration(&this->super_Compiler,local_40,DecorationNonUniform);
  local_99 = false;
  if (bVar1) {
    local_44 = (pSStack_28->super_IVariant).self.id;
    bVar1 = Compiler::has_decoration(&this->super_Compiler,(ID)local_44,DecorationBlock);
    local_a9 = true;
    if (!bVar1) {
      local_48 = (pSStack_28->super_IVariant).self.id;
      local_a9 = Compiler::has_decoration(&this->super_Compiler,(ID)local_48,DecorationBufferBlock);
    }
    local_99 = local_a9;
  }
  local_3b = local_99;
  if (local_99 != false) {
    ::std::__cxx11::string::operator+=((string *)psStack_18,(this->backend).nonuniform_qualifier);
    ::std::__cxx11::string::operator+=((string *)psStack_18,"(");
  }
  if ((local_39 & 1) == 0) {
    to_expression_abi_cxx11_((CompilerGLSL *)local_98,(uint32_t)this,SUB41(index,0));
    ::std::__cxx11::string::operator+=((string *)psStack_18,(string *)local_98);
    ::std::__cxx11::string::~string((string *)local_98);
  }
  else {
    convert_to_string<unsigned_int,_0>((spirv_cross *)(local_98 + 0x30),&index);
    ::std::__cxx11::string::operator+=((string *)psStack_18,(string *)(local_98 + 0x30));
    ::std::__cxx11::string::~string((string *)(local_98 + 0x30));
  }
  if ((local_3b & 1U) != 0) {
    ::std::__cxx11::string::operator+=((string *)psStack_18,")");
  }
  ::std::__cxx11::string::operator+=((string *)psStack_18,"]");
  return;
}

Assistant:

void CompilerGLSL::access_chain_internal_append_index(std::string &expr, uint32_t /*base*/, const SPIRType *type,
                                                      AccessChainFlags flags, bool & /*access_chain_is_arrayed*/,
                                                      uint32_t index)
{
	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;

	expr += "[";

	// If we are indexing into an array of SSBOs or UBOs, we need to index it with a non-uniform qualifier.
	bool nonuniform_index =
	    has_decoration(index, DecorationNonUniformEXT) &&
	    (has_decoration(type->self, DecorationBlock) || has_decoration(type->self, DecorationBufferBlock));
	if (nonuniform_index)
	{
		expr += backend.nonuniform_qualifier;
		expr += "(";
	}

	if (index_is_literal)
		expr += convert_to_string(index);
	else
		expr += to_expression(index, register_expression_read);

	if (nonuniform_index)
		expr += ")";

	expr += "]";
}